

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O2

void __thiscall
TEST_PlayerHandTest_Sequence_TestShell::TEST_PlayerHandTest_Sequence_TestShell
          (TEST_PlayerHandTest_Sequence_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_001dd2b0;
  return;
}

Assistant:

TEST(PlayerHandTest, Sequence)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::TwoOfCircles);
	h.add(Tile::ThreeOfCircles);

	h.bindSequence({
		Tile::OneOfCircles,
		Tile::TwoOfCircles,
		Tile::ThreeOfCircles
	});

	CHECK(!h.isClosedHand());
}